

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O0

void precount_char_init(void)

{
  char cVar1;
  char k;
  int j_shift;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  uint8_t j;
  uint8_t res [8];
  int i;
  
  res[0] = '\x01';
  res[1] = '\0';
  res[2] = '\0';
  res[3] = '\0';
  for (; (int)res._0_4_ < 0x101; res._0_4_ = res._0_4_ + 1) {
    memset(&j_shift,0,8);
    char_get_bits_raised((uint8_t *)&j_shift,(uint8_t)res._0_4_);
    for (k = '\0'; (byte)k < 0xc; k = k + '\x01') {
      cVar1 = k * '\b';
      if ((((((char)j_shift != '\0') &&
            (precount2[(byte)k][(int)res._0_4_][1] = (char)j_shift + cVar1, j_shift._1_1_ != '\0'))
           && (precount2[(byte)k][(int)res._0_4_][2] = j_shift._1_1_ + cVar1, j_shift._2_1_ != '\0')
           ) && ((precount2[(byte)k][(int)res._0_4_][3] = j_shift._2_1_ + cVar1,
                 j_shift._3_1_ != '\0' &&
                 (precount2[(byte)k][(int)res._0_4_][4] = j_shift._3_1_ + cVar1, cStack_10 != '\0'))
                )) &&
         ((precount2[(byte)k][(int)res._0_4_][5] = cStack_10 + cVar1, cStack_f != '\0' &&
          ((precount2[(byte)k][(int)res._0_4_][6] = cStack_f + cVar1, cStack_e != '\0' &&
           (precount2[(byte)k][(int)res._0_4_][7] = cStack_e + cVar1, j != '\0')))))) {
        precount2[(byte)k][(long)(int)res._0_4_ + 1][0] = j + cVar1;
      }
    }
  }
  return;
}

Assistant:

void precount_char_init() {
    for (int i = 1; i <= 256; ++i) { //each byte value cycle
        uint8_t res[8] = {};
        char_get_bits_raised(res, i);
        for (uint8_t j = 0; j < 12; ++j) { //each bitmask index value cycle
            int j_shift = j << 3;
            char k = 0;
            //this construction works even on -O3 and -Ofast
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
        }
    }
}